

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

ssize_t __thiscall Matrix::read(Matrix *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int *sizes;
  ulong uVar4;
  undefined4 in_register_00000034;
  long lVar5;
  ulong uVar6;
  shared_array<double> local_38;
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  uVar1 = *(uint *)(lVar5 + 0xd8);
  uVar6 = 1;
  if ((ulong)uVar1 != 1) {
    uVar6 = (ulong)(uVar1 - 1);
  }
  sizes = (int *)operator_new__(uVar6 * 4);
  *sizes = 1;
  lVar3 = *(long *)(lVar5 + 0xc0);
  for (uVar4 = 1; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    sizes[uVar4 - 1] = *(int *)(lVar3 + uVar4 * 4);
  }
  local_38.px = *(double **)(lVar5 + 0xa8);
  iVar2 = **(int **)(lVar5 + 200);
  lVar3 = *(long *)(lVar5 + 0xa0);
  local_38.pn.pi_ = *(sp_counted_base **)(lVar5 + 0xb0);
  if (local_38.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_38.pn.pi_)->use_count_ = (local_38.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  Matrix(this,(double *)((long)(int)__buf * (long)iVar2 * 8 + lVar3),&local_38,sizes,(int)uVar6);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return (ssize_t)this;
}

Assistant:

const Matrix Matrix::read(int i) const
{
    uint dimension = uint(nMatrixDimension==1 ? 1 : nMatrixDimension-1);
    int *sizes = new int[dimension];
    sizes[0] = 1;
    for (uint s=1; s<uint(nMatrixDimension); s++)
         sizes[s-1] = pSize[s];
    return Matrix( &(pData[i*pMult[0]]), matrixParent, sizes, dimension );
}